

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result wabt::ParseWatModule
                 (WastLexer *lexer,
                 unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *out_module,
                 Errors *errors,WastParseOptions *options)

{
  bool bVar1;
  Result result;
  undefined1 local_e0 [8];
  WastParser parser;
  WastParseOptions *options_local;
  Errors *errors_local;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *out_module_local;
  WastLexer *lexer_local;
  
  parser.tokens_.front_ = (size_type)options;
  if (out_module == (unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)0x0) {
    __assert_fail("out_module != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wast-parser.cc"
                  ,0xc45,
                  "Result wabt::ParseWatModule(WastLexer *, std::unique_ptr<Module> *, Errors *, WastParseOptions *)"
                 );
  }
  if (options != (WastParseOptions *)0x0) {
    WastParser::WastParser((WastParser *)local_e0,lexer,errors,options);
    result = WastParser::ParseModule((WastParser *)local_e0,out_module);
    bVar1 = Failed(result);
    if (bVar1) {
      Result::Result((Result *)((long)&lexer_local + 4),Error);
    }
    else {
      Result::Result((Result *)((long)&lexer_local + 4),Ok);
    }
    WastParser::~WastParser((WastParser *)local_e0);
    return (Result)lexer_local._4_4_;
  }
  __assert_fail("options != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wast-parser.cc"
                ,0xc46,
                "Result wabt::ParseWatModule(WastLexer *, std::unique_ptr<Module> *, Errors *, WastParseOptions *)"
               );
}

Assistant:

Result ParseWatModule(WastLexer* lexer,
                      std::unique_ptr<Module>* out_module,
                      Errors* errors,
                      WastParseOptions* options) {
  assert(out_module != nullptr);
  assert(options != nullptr);
  WastParser parser(lexer, errors, options);
  CHECK_RESULT(parser.ParseModule(out_module));
  return Result::Ok;
}